

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CMipsArchitecture::parseOpcode(CMipsArchitecture *this,Parser *parser)

{
  bool bVar1;
  undefined1 local_420 [24];
  undefined1 local_408 [8];
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> macro;
  MipsParser mipsParser;
  Parser *parser_local;
  CMipsArchitecture *this_local;
  
  MipsParser::MipsParser((MipsParser *)&macro);
  MipsParser::parseMacro((MipsParser *)local_408,(Parser *)&macro);
  bVar1 = std::operator!=((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                          local_408,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
              ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)this,
               (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_408);
  }
  else {
    MipsParser::parseOpcode((MipsParser *)local_420,(Parser *)&macro);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<CMipsInstruction,std::default_delete<CMipsInstruction>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_> *)local_420);
    std::unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_>::~unique_ptr
              ((unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_> *)local_420);
  }
  local_420._8_4_ = 1;
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
            ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_408);
  MipsParser::~MipsParser((MipsParser *)&macro);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CMipsArchitecture::parseOpcode(Parser& parser)
{
	MipsParser mipsParser;

	std::unique_ptr<CAssemblerCommand> macro = mipsParser.parseMacro(parser);
	if (macro != nullptr)
		return macro;

	return mipsParser.parseOpcode(parser);
}